

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O3

float Gia_ManComputeSwitching(Gia_Man_t *p,int nFrames,int nPref,int fProbOne)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *__ptr;
  Vec_Int_t *pVVar4;
  int *piVar5;
  uint uVar6;
  Vec_Int_t *__ptr_00;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  float fVar13;
  
  __ptr_00 = Gia_ManComputeSwitchProbs(p,nFrames,nPref,fProbOne);
  __ptr = __ptr_00->pArray;
  pVVar4 = p->vMapping;
  uVar1 = p->nObjs;
  if (pVVar4 == (Vec_Int_t *)0x0) {
    if ((int)uVar1 < 1) {
LAB_00230af0:
      fVar13 = 0.0;
    }
    else {
      lVar8 = 0;
      lVar10 = 0;
      fVar13 = 0.0;
      do {
        if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_00230af0;
        uVar7 = *(ulong *)(&p->pObjs->field_0x0 + lVar8);
        if ((~(uint)uVar7 & 0x1fffffff) != 0 && -1 < (int)(uint)uVar7) {
          fVar13 = fVar13 + *(float *)((long)__ptr +
                                      ((long)((uVar7 & 0x1fffffff) * -0x100000000 + lVar10) >> 0x1e)
                                      ) +
                            *(float *)((long)__ptr +
                                      ((long)((uVar7 >> 0x20 & 0x1fffffff) * -0x100000000 + lVar10)
                                      >> 0x1e));
        }
        lVar10 = lVar10 + 0x100000000;
        lVar8 = lVar8 + 0xc;
      } while ((ulong)uVar1 * 0xc != lVar8);
    }
  }
  else {
    fVar13 = 0.0;
    if (1 < (int)uVar1) {
      uVar2 = pVVar4->nSize;
      uVar7 = 1;
      if (1 < (int)uVar2) {
        uVar7 = (ulong)uVar2;
      }
      uVar9 = 1;
      do {
        if (uVar9 == uVar7) {
LAB_00230b1c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar5 = pVVar4->pArray;
        uVar3 = piVar5[uVar9];
        uVar11 = (ulong)uVar3;
        if (uVar11 != 0) {
          if (((int)uVar3 < 0) || (uVar2 <= uVar3)) goto LAB_00230b1c;
          uVar3 = piVar5[uVar11];
          uVar6 = uVar3;
          if ((int)uVar3 < 1) {
            uVar6 = 0;
          }
          if (0 < (int)uVar3) {
            uVar12 = 0;
            do {
              fVar13 = fVar13 + (float)__ptr[piVar5[uVar11 + uVar12 + 1]];
              uVar12 = uVar12 + 1;
            } while (uVar6 != uVar12);
          }
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar1);
    }
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(__ptr_00);
  return fVar13;
}

Assistant:

float Gia_ManComputeSwitching( Gia_Man_t * p, int nFrames, int nPref, int fProbOne )
{
    Vec_Int_t * vSwitching = Gia_ManComputeSwitchProbs( p, nFrames, nPref, fProbOne );
    float * pSwi = (float *)Vec_IntArray(vSwitching), SwiTotal = 0;
    Gia_Obj_t * pObj;
    int i, k, iFan;
    if ( Gia_ManHasMapping(p) )
    {
        Gia_ManForEachLut( p, i )
            Gia_LutForEachFanin( p, i, iFan, k )
                SwiTotal += pSwi[iFan];
    }
    else
    {
        Gia_ManForEachAnd( p, pObj, i )
            SwiTotal += pSwi[Gia_ObjFaninId0(pObj, i)] + pSwi[Gia_ObjFaninId1(pObj, i)];
    }
    Vec_IntFree( vSwitching );
    return SwiTotal;
}